

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
google::protobuf::internal::GeneratedMessageReflection::AddField<std::__cxx11::string>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  RepeatedPtrFieldBase *this_00;
  int iVar1;
  Arena *this_01;
  uint32 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *elem;
  int iVar3;
  Rep *pRVar4;
  
  uVar2 = ReflectionSchema::GetFieldOffset(&this->schema_,field);
  this_00 = (RepeatedPtrFieldBase *)
            ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
  pRVar4 = *(Rep **)((long)&message[2].super_MessageLite._vptr_MessageLite + (ulong)uVar2);
  if (pRVar4 == (Rep *)0x0) {
    iVar3 = this_00->total_size_;
  }
  else {
    iVar1 = this_00->current_size_;
    iVar3 = pRVar4->allocated_size;
    if (iVar1 < iVar3) {
      this_00->current_size_ = iVar1 + 1;
      return (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             pRVar4->elements[iVar1];
    }
    if (iVar3 != this_00->total_size_) goto LAB_005b1ce5;
  }
  RepeatedPtrFieldBase::Reserve(this_00,iVar3 + 1);
  pRVar4 = this_00->rep_;
  iVar3 = pRVar4->allocated_size;
LAB_005b1ce5:
  pRVar4->allocated_size = iVar3 + 1;
  this_01 = this_00->arena_;
  if (this_01 == (Arena *)0x0) {
    elem = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x20);
    (elem->_M_dataplus)._M_p = (pointer)&elem->field_2;
    elem->_M_string_length = 0;
    (elem->field_2)._M_local_buf[0] = '\0';
  }
  else {
    elem = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Arena::AllocateAligned(this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    (elem->_M_dataplus)._M_p = (pointer)&elem->field_2;
    elem->_M_string_length = 0;
    (elem->field_2)._M_local_buf[0] = '\0';
    Arena::AddListNode(this_01,elem,arena_destruct_object<std::__cxx11::string>);
    pRVar4 = this_00->rep_;
  }
  iVar3 = this_00->current_size_;
  this_00->current_size_ = iVar3 + 1;
  pRVar4->elements[iVar3] = elem;
  return elem;
}

Assistant:

inline Type* GeneratedMessageReflection::AddField(
    Message* message, const FieldDescriptor* field) const {
  RepeatedPtrField<Type>* repeated =
    MutableRaw<RepeatedPtrField<Type> >(message, field);
  return repeated->Add();
}